

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::TTDebuggerSourceLocation::SetLocationCopy
          (TTDebuggerSourceLocation *this,TTDebuggerSourceLocation *other)

{
  int64 iVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  
  iVar1 = other->m_bpId;
  this->m_sourceScriptLogId = other->m_sourceScriptLogId;
  this->m_bpId = iVar1;
  iVar1 = other->m_ftime;
  this->m_etime = other->m_etime;
  this->m_ftime = iVar1;
  this->m_ltime = other->m_ltime;
  uVar2 = other->m_functionLine;
  uVar3 = other->m_functionColumn;
  uVar4 = other->m_line;
  this->m_topLevelBodyId = other->m_topLevelBodyId;
  this->m_functionLine = uVar2;
  this->m_functionColumn = uVar3;
  this->m_line = uVar4;
  this->m_column = other->m_column;
  return;
}

Assistant:

void TTDebuggerSourceLocation::SetLocationCopy(const TTDebuggerSourceLocation& other)
    {
        this->m_sourceScriptLogId = other.m_sourceScriptLogId;
        this->m_bpId = other.m_bpId;

        this->m_etime = other.m_etime;
        this->m_ftime = other.m_ftime;
        this->m_ltime = other.m_ltime;

        this->m_topLevelBodyId = other.m_topLevelBodyId;

        this->m_functionLine = other.m_functionLine;
        this->m_functionColumn = other.m_functionColumn;

        this->m_line = other.m_line;
        this->m_column = other.m_column;
    }